

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx::
     BVHNIntersectorKHybrid<4,_4,_257,_true,_embree::avx::VirtualCurveIntersectorK<4>,_true>::
     occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  vfloat<4> vVar9;
  byte bVar10;
  BVH *bvh;
  size_t sVar11;
  void *pvVar12;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar13;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar14;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar15;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined8 uVar21;
  undefined8 uVar22;
  vbool<4> vVar23;
  size_t sVar24;
  char cVar25;
  bool bVar26;
  uint uVar27;
  undefined4 uVar28;
  int iVar29;
  uint uVar30;
  ulong uVar31;
  long lVar32;
  size_t sVar33;
  NodeRef root;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar34;
  NodeRef *pNVar35;
  vint4 ai_3;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 in_ZMM0 [64];
  vint4 ai_1;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  vint4 ai;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  vint4 bi;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  vint4 bi_1;
  undefined1 auVar59 [16];
  vint4 bi_3;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  float fVar65;
  float fVar68;
  float fVar69;
  vint4 ai_2;
  float fVar70;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  vint4 bi_2;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  vfloat4 a0;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  float fVar77;
  float fVar82;
  float fVar83;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  float fVar84;
  float fVar85;
  float fVar93;
  float fVar94;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar89;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  float fVar95;
  undefined1 auVar92 [64];
  float fVar96;
  float fVar100;
  float fVar101;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  float fVar102;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [64];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  vbool<4> terminated;
  undefined4 local_18a8 [4];
  TravRayK<4,_true> tray;
  Precalculations pre;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  uVar22 = mm_lookupmask_ps._8_8_;
  uVar21 = mm_lookupmask_ps._0_8_;
  bvh = (BVH *)This->ptr;
  sVar33 = (bvh->root).ptr;
  if (sVar33 != 8) {
    auVar47 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar71 = vpcmpeqd_avx(auVar47,(undefined1  [16])valid_i->field_0);
    auVar47 = *(undefined1 (*) [16])(ray + 0x80);
    auVar44 = ZEXT816(0) << 0x40;
    auVar50 = vcmpps_avx(auVar47,auVar44,5);
    auVar50 = vandps_avx(auVar50,auVar71);
    uVar30 = vmovmskps_avx(auVar50);
    if (uVar30 != 0) {
      uVar31 = (ulong)(uVar30 & 0xff);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar60._0_4_ =
           tray.dir.field_0._0_4_ * tray.dir.field_0._0_4_ +
           tray.dir.field_0._32_4_ * tray.dir.field_0._32_4_ +
           tray.dir.field_0._16_4_ * tray.dir.field_0._16_4_;
      auVar60._4_4_ =
           tray.dir.field_0._4_4_ * tray.dir.field_0._4_4_ +
           tray.dir.field_0._36_4_ * tray.dir.field_0._36_4_ +
           tray.dir.field_0._20_4_ * tray.dir.field_0._20_4_;
      auVar60._8_4_ =
           tray.dir.field_0._8_4_ * tray.dir.field_0._8_4_ +
           tray.dir.field_0._40_4_ * tray.dir.field_0._40_4_ +
           tray.dir.field_0._24_4_ * tray.dir.field_0._24_4_;
      auVar60._12_4_ =
           tray.dir.field_0._12_4_ * tray.dir.field_0._12_4_ +
           tray.dir.field_0._44_4_ * tray.dir.field_0._44_4_ +
           tray.dir.field_0._28_4_ * tray.dir.field_0._28_4_;
      auVar71 = vrsqrtps_avx(auVar60);
      fVar65 = auVar71._0_4_;
      fVar68 = auVar71._4_4_;
      fVar69 = auVar71._8_4_;
      fVar70 = auVar71._12_4_;
      pre.depth_scale.field_0.v[0] = fVar65 * 1.5 + fVar65 * fVar65 * fVar65 * auVar60._0_4_ * -0.5;
      pre.depth_scale.field_0.v[1] = fVar68 * 1.5 + fVar68 * fVar68 * fVar68 * auVar60._4_4_ * -0.5;
      pre.depth_scale.field_0.v[2] = fVar69 * 1.5 + fVar69 * fVar69 * fVar69 * auVar60._8_4_ * -0.5;
      pre.depth_scale.field_0.v[3] = fVar70 * 1.5 + fVar70 * fVar70 * fVar70 * auVar60._12_4_ * -0.5
      ;
      while (uVar31 != 0) {
        lVar32 = 0;
        if (uVar31 != 0) {
          for (; (uVar31 >> lVar32 & 1) == 0; lVar32 = lVar32 + 1) {
          }
        }
        auVar71 = vinsertps_avx(ZEXT416(*(uint *)(ray + lVar32 * 4 + 0x40)),
                                ZEXT416(*(uint *)(ray + lVar32 * 4 + 0x50)),0x1c);
        auVar71 = vinsertps_avx(auVar71,ZEXT416(*(uint *)(ray + lVar32 * 4 + 0x60)),0x28);
        fVar65 = *(float *)((long)pre.ray_space + lVar32 * 4 + -0x10);
        auVar75._0_4_ = auVar71._0_4_ * fVar65;
        auVar75._4_4_ = auVar71._4_4_ * fVar65;
        auVar75._8_4_ = auVar71._8_4_ * fVar65;
        auVar75._12_4_ = auVar71._12_4_ * fVar65;
        auVar60 = vshufpd_avx(auVar75,auVar75,1);
        auVar71 = vmovshdup_avx(auVar75);
        auVar103._8_4_ = 0x80000000;
        auVar103._0_8_ = 0x8000000080000000;
        auVar103._12_4_ = 0x80000000;
        auVar86._0_4_ = auVar71._0_4_ ^ 0x80000000;
        auVar71 = vunpckhps_avx(auVar75,auVar44);
        auVar86._4_12_ = ZEXT812(0) << 0x20;
        auVar79 = vshufps_avx(auVar71,auVar86,0x41);
        auVar78._0_8_ = auVar60._0_8_ ^ 0x8000000080000000;
        auVar78._8_8_ = auVar60._8_8_ ^ auVar103._8_8_;
        auVar78 = vinsertps_avx(auVar78,auVar75,0x2a);
        auVar71 = vdpps_avx(auVar79,auVar79,0x7f);
        auVar60 = vdpps_avx(auVar78,auVar78,0x7f);
        auVar71 = vcmpps_avx(auVar60,auVar71,1);
        auVar71 = vshufps_avx(auVar71,auVar71,0);
        auVar71 = vblendvps_avx(auVar78,auVar79,auVar71);
        auVar60 = vdpps_avx(auVar71,auVar71,0x7f);
        auVar78 = vrsqrtss_avx(auVar60,auVar60);
        fVar68 = auVar78._0_4_;
        auVar60 = ZEXT416((uint)(fVar68 * 1.5 - auVar60._0_4_ * 0.5 * fVar68 * fVar68 * fVar68));
        auVar60 = vshufps_avx(auVar60,auVar60,0);
        auVar79._0_4_ = auVar71._0_4_ * auVar60._0_4_;
        auVar79._4_4_ = auVar71._4_4_ * auVar60._4_4_;
        auVar79._8_4_ = auVar71._8_4_ * auVar60._8_4_;
        auVar79._12_4_ = auVar71._12_4_ * auVar60._12_4_;
        auVar71 = vshufps_avx(auVar79,auVar79,0xc9);
        auVar60 = vshufps_avx(auVar75,auVar75,0xc9);
        auVar97._0_4_ = auVar60._0_4_ * auVar79._0_4_;
        auVar97._4_4_ = auVar60._4_4_ * auVar79._4_4_;
        auVar97._8_4_ = auVar60._8_4_ * auVar79._8_4_;
        auVar97._12_4_ = auVar60._12_4_ * auVar79._12_4_;
        auVar87._0_4_ = auVar75._0_4_ * auVar71._0_4_;
        auVar87._4_4_ = auVar75._4_4_ * auVar71._4_4_;
        auVar87._8_4_ = auVar75._8_4_ * auVar71._8_4_;
        auVar87._12_4_ = auVar75._12_4_ * auVar71._12_4_;
        auVar71 = vsubps_avx(auVar87,auVar97);
        auVar78 = vshufps_avx(auVar71,auVar71,0xc9);
        auVar71 = vdpps_avx(auVar78,auVar78,0x7f);
        uVar31 = uVar31 & uVar31 - 1;
        auVar60 = vrsqrtss_avx(auVar71,auVar71);
        fVar68 = auVar60._0_4_;
        auVar71 = ZEXT416((uint)(fVar68 * 1.5 - auVar71._0_4_ * 0.5 * fVar68 * fVar68 * fVar68));
        auVar71 = vshufps_avx(auVar71,auVar71,0);
        auVar88._0_4_ = auVar71._0_4_ * auVar78._0_4_;
        auVar88._4_4_ = auVar71._4_4_ * auVar78._4_4_;
        auVar88._8_4_ = auVar71._8_4_ * auVar78._8_4_;
        auVar88._12_4_ = auVar71._12_4_ * auVar78._12_4_;
        auVar71._0_4_ = auVar75._0_4_ * fVar65;
        auVar71._4_4_ = auVar75._4_4_ * fVar65;
        auVar71._8_4_ = auVar75._8_4_ * fVar65;
        auVar71._12_4_ = auVar75._12_4_ * fVar65;
        auVar78 = vunpcklps_avx(auVar79,auVar71);
        auVar71 = vunpckhps_avx(auVar79,auVar71);
        auVar79 = vunpcklps_avx(auVar88,auVar44);
        auVar60 = vunpckhps_avx(auVar88,auVar44);
        aVar15 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpcklps_avx(auVar71,auVar60);
        aVar16 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpcklps_avx(auVar78,auVar79);
        aVar14 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpckhps_avx(auVar78,auVar79);
        pre.ray_space[lVar32].vx.field_0 = aVar16;
        pre.ray_space[lVar32].vy.field_0 = aVar14;
        pre.ray_space[lVar32].vz.field_0 = aVar15;
      }
      tray.org.field_0._0_4_ = (undefined4)*(undefined8 *)ray;
      tray.org.field_0._4_4_ = (undefined4)((ulong)*(undefined8 *)ray >> 0x20);
      tray.org.field_0._8_4_ = (undefined4)*(undefined8 *)(ray + 8);
      tray.org.field_0._12_4_ = (undefined4)((ulong)*(undefined8 *)(ray + 8) >> 0x20);
      tray.org.field_0._16_4_ = (undefined4)*(undefined8 *)(ray + 0x10);
      tray.org.field_0._20_4_ = (undefined4)((ulong)*(undefined8 *)(ray + 0x10) >> 0x20);
      tray.org.field_0._24_4_ = (undefined4)*(undefined8 *)(ray + 0x18);
      tray.org.field_0._28_4_ = (undefined4)((ulong)*(undefined8 *)(ray + 0x18) >> 0x20);
      tray.org.field_0._32_4_ = (undefined4)*(undefined8 *)(ray + 0x20);
      tray.org.field_0._36_4_ = (undefined4)((ulong)*(undefined8 *)(ray + 0x20) >> 0x20);
      tray.org.field_0._40_4_ = (undefined4)*(undefined8 *)(ray + 0x28);
      tray.org.field_0._44_4_ = (undefined4)((ulong)*(undefined8 *)(ray + 0x28) >> 0x20);
      auVar66._8_4_ = 0x7fffffff;
      auVar66._0_8_ = 0x7fffffff7fffffff;
      auVar66._12_4_ = 0x7fffffff;
      auVar71 = vandps_avx((undefined1  [16])tray.dir.field_0.field_0.x.field_0,auVar66);
      auVar72._8_4_ = 0x219392ef;
      auVar72._0_8_ = 0x219392ef219392ef;
      auVar72._12_4_ = 0x219392ef;
      auVar44 = vcmpps_avx(auVar71,auVar72,1);
      auVar76._8_4_ = 0x3f800000;
      auVar76._0_8_ = 0x3f8000003f800000;
      auVar76._12_4_ = 0x3f800000;
      auVar78 = vdivps_avx(auVar76,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar71 = vandps_avx((undefined1  [16])tray.dir.field_0.field_0.y.field_0,auVar66);
      auVar60 = vcmpps_avx(auVar71,auVar72,1);
      auVar79 = vdivps_avx(auVar76,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar71 = vandps_avx((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar66);
      auVar71 = vcmpps_avx(auVar71,auVar72,1);
      auVar75 = vdivps_avx(auVar76,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      auVar73._8_4_ = 0x5d5e0b6b;
      auVar73._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar73._12_4_ = 0x5d5e0b6b;
      tray.rdir.field_0.field_0.x.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar78,auVar73,auVar44);
      tray.rdir.field_0.field_0.y.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar79,auVar73,auVar60);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar75,auVar73,auVar71);
      auVar44 = ZEXT816(0) << 0x20;
      auVar71 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar44,1);
      auVar61._8_4_ = 0x10;
      auVar61._0_8_ = 0x1000000010;
      auVar61._12_4_ = 0x10;
      tray.nearXYZ.field_0.field_0.x.field_0 = (vint_impl<4>)vandps_avx(auVar71,auVar61);
      auVar71 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar44,5);
      auVar62._8_4_ = 0x20;
      auVar62._0_8_ = 0x2000000020;
      auVar62._12_4_ = 0x20;
      auVar67._8_4_ = 0x30;
      auVar67._0_8_ = 0x3000000030;
      auVar67._12_4_ = 0x30;
      tray.nearXYZ.field_0.field_0.y.field_0 = (vint_impl<4>)vblendvps_avx(auVar67,auVar62,auVar71);
      auVar71 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar44,5);
      auVar51._8_4_ = 0x40;
      auVar51._0_8_ = 0x4000000040;
      auVar51._12_4_ = 0x40;
      auVar56._8_4_ = 0x50;
      auVar56._0_8_ = 0x5000000050;
      auVar56._12_4_ = 0x50;
      tray.nearXYZ.field_0.field_0.z.field_0 = (vint_impl<4>)vblendvps_avx(auVar56,auVar51,auVar71);
      auVar71 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar44);
      auVar47 = vmaxps_avx(auVar47,auVar44);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar92 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           vblendvps_avx((undefined1  [16])stack_near[0].field_0,auVar71,auVar50);
      auVar44._8_4_ = 0xff800000;
      auVar44._0_8_ = 0xff800000ff800000;
      auVar44._12_4_ = 0xff800000;
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar44,auVar47,auVar50);
      auVar47 = vpcmpeqd_avx((undefined1  [16])tray.tfar.field_0,(undefined1  [16])tray.tfar.field_0
                            );
      terminated.field_0._0_4_ = auVar50._0_4_ ^ auVar47._0_4_;
      terminated.field_0._4_4_ = auVar50._4_4_ ^ auVar47._4_4_;
      terminated.field_0._8_4_ = auVar50._8_4_ ^ auVar47._8_4_;
      terminated.field_0._12_4_ = auVar50._12_4_ ^ auVar47._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar30 = 3;
      }
      else {
        uVar30 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      pNVar35 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar34 = &stack_near[2].field_0;
      stack_node[1].ptr = sVar33;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
LAB_00ec8ff6:
      do {
        do {
          root.ptr = pNVar35[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_00ec963a;
          pNVar35 = pNVar35 + -1;
          paVar34 = paVar34 + -1;
          vVar9.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar34->v;
          auVar105 = ZEXT1664((undefined1  [16])vVar9.field_0);
          auVar47 = vcmpps_avx((undefined1  [16])vVar9.field_0,(undefined1  [16])tray.tfar.field_0,1
                              );
          uVar27 = vmovmskps_avx(auVar47);
        } while (uVar27 == 0);
        uVar31 = (ulong)(uVar27 & 0xff);
        uVar27 = POPCOUNT(uVar27 & 0xff);
        if (uVar30 < uVar27) {
LAB_00ec9034:
          do {
            vVar23.field_0 = terminated.field_0;
            sVar33 = 8;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_00ec963a;
              auVar47 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,auVar105._0_16_,6);
              if ((((auVar47 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar47 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar47 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar47[0xf] < '\0') {
                bVar10 = *(byte *)(root.ptr & 0xfffffffffffffff0);
                pvVar12 = This->leafIntersector;
                local_18a8._0_8_ = uVar21;
                local_18a8._8_8_ = uVar22;
                uVar27 = vmovmskps_avx((undefined1  [16])terminated.field_0);
                uVar31 = (ulong)(uVar27 ^ 0xf);
                while (uVar31 != 0) {
                  lVar32 = 0;
                  if (uVar31 != 0) {
                    for (; (uVar31 >> lVar32 & 1) == 0; lVar32 = lVar32 + 1) {
                    }
                  }
                  uVar31 = uVar31 & uVar31 - 1;
                  cVar25 = (**(code **)((long)pvVar12 + (ulong)bVar10 * 0x40 + 0x18))
                                     (&pre,ray,lVar32,context,
                                      (byte *)(root.ptr & 0xfffffffffffffff0));
                  auVar92 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
                  if (cVar25 != '\0') {
                    local_18a8[lVar32] = 0xffffffff;
                  }
                }
                auVar17._8_4_ = local_18a8[2];
                auVar17._12_4_ = local_18a8[3];
                auVar17._0_4_ = local_18a8[0];
                auVar17._4_4_ = local_18a8[1];
                terminated.field_0 =
                     (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
                     vorps_avx((undefined1  [16])vVar23.field_0,auVar17);
                auVar47 = _DAT_01f46b70 & ~(undefined1  [16])terminated.field_0;
                if ((((auVar47 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                     (auVar47 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar47 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    -1 < auVar47[0xf]) goto LAB_00ec963a;
                auVar55._8_4_ = 0xff800000;
                auVar55._0_8_ = 0xff800000ff800000;
                auVar55._12_4_ = 0xff800000;
                tray.tfar.field_0 =
                     (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar55,
                                   (undefined1  [16])terminated.field_0);
              }
              goto LAB_00ec8ff6;
            }
            uVar31 = root.ptr & 0xfffffffffffffff0;
            aVar89 = auVar92._0_16_;
            for (lVar32 = 0x1c;
                (auVar105 = ZEXT1664((undefined1  [16])aVar89), lVar32 != 0x20 &&
                (sVar11 = *(size_t *)((uVar31 - 0xe0) + lVar32 * 8), sVar11 != 8));
                lVar32 = lVar32 + 1) {
              if ((root.ptr & 7) == 0) {
                uVar28 = *(undefined4 *)((root.ptr - 0x50) + lVar32 * 4);
                auVar36._4_4_ = uVar28;
                auVar36._0_4_ = uVar28;
                auVar36._8_4_ = uVar28;
                auVar36._12_4_ = uVar28;
                auVar18._4_4_ = tray.org.field_0._4_4_;
                auVar18._0_4_ = tray.org.field_0._0_4_;
                auVar18._8_4_ = tray.org.field_0._8_4_;
                auVar18._12_4_ = tray.org.field_0._12_4_;
                auVar19._4_4_ = tray.org.field_0._20_4_;
                auVar19._0_4_ = tray.org.field_0._16_4_;
                auVar19._8_4_ = tray.org.field_0._24_4_;
                auVar19._12_4_ = tray.org.field_0._28_4_;
                auVar20._4_4_ = tray.org.field_0._36_4_;
                auVar20._0_4_ = tray.org.field_0._32_4_;
                auVar20._8_4_ = tray.org.field_0._40_4_;
                auVar20._12_4_ = tray.org.field_0._44_4_;
                auVar47 = vsubps_avx(auVar36,auVar18);
                auVar63._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar47._0_4_;
                auVar63._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar47._4_4_;
                auVar63._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar47._8_4_;
                auVar63._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar47._12_4_;
                uVar28 = *(undefined4 *)((root.ptr - 0x30) + lVar32 * 4);
                auVar37._4_4_ = uVar28;
                auVar37._0_4_ = uVar28;
                auVar37._8_4_ = uVar28;
                auVar37._12_4_ = uVar28;
                auVar47 = vsubps_avx(auVar37,auVar19);
                auVar74._0_4_ = tray.rdir.field_0._16_4_ * auVar47._0_4_;
                auVar74._4_4_ = tray.rdir.field_0._20_4_ * auVar47._4_4_;
                auVar74._8_4_ = tray.rdir.field_0._24_4_ * auVar47._8_4_;
                auVar74._12_4_ = tray.rdir.field_0._28_4_ * auVar47._12_4_;
                uVar28 = *(undefined4 *)((root.ptr - 0x10) + lVar32 * 4);
                auVar38._4_4_ = uVar28;
                auVar38._0_4_ = uVar28;
                auVar38._8_4_ = uVar28;
                auVar38._12_4_ = uVar28;
                auVar47 = vsubps_avx(auVar38,auVar20);
                auVar80._0_4_ = tray.rdir.field_0._32_4_ * auVar47._0_4_;
                auVar80._4_4_ = tray.rdir.field_0._36_4_ * auVar47._4_4_;
                auVar80._8_4_ = tray.rdir.field_0._40_4_ * auVar47._8_4_;
                auVar80._12_4_ = tray.rdir.field_0._44_4_ * auVar47._12_4_;
                uVar28 = *(undefined4 *)((root.ptr - 0x40) + lVar32 * 4);
                auVar39._4_4_ = uVar28;
                auVar39._0_4_ = uVar28;
                auVar39._8_4_ = uVar28;
                auVar39._12_4_ = uVar28;
                auVar47 = vsubps_avx(auVar39,auVar18);
                auVar45._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar47._0_4_;
                auVar45._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar47._4_4_;
                auVar45._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar47._8_4_;
                auVar45._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar47._12_4_;
                uVar28 = *(undefined4 *)((root.ptr - 0x20) + lVar32 * 4);
                auVar40._4_4_ = uVar28;
                auVar40._0_4_ = uVar28;
                auVar40._8_4_ = uVar28;
                auVar40._12_4_ = uVar28;
                auVar47 = vsubps_avx(auVar40,auVar19);
                auVar52._0_4_ = tray.rdir.field_0._16_4_ * auVar47._0_4_;
                auVar52._4_4_ = tray.rdir.field_0._20_4_ * auVar47._4_4_;
                auVar52._8_4_ = tray.rdir.field_0._24_4_ * auVar47._8_4_;
                auVar52._12_4_ = tray.rdir.field_0._28_4_ * auVar47._12_4_;
                uVar28 = *(undefined4 *)(root.ptr + lVar32 * 4);
                auVar41._4_4_ = uVar28;
                auVar41._0_4_ = uVar28;
                auVar41._8_4_ = uVar28;
                auVar41._12_4_ = uVar28;
                auVar47 = vsubps_avx(auVar41,auVar20);
                auVar57._0_4_ = tray.rdir.field_0._32_4_ * auVar47._0_4_;
                auVar57._4_4_ = tray.rdir.field_0._36_4_ * auVar47._4_4_;
                auVar57._8_4_ = tray.rdir.field_0._40_4_ * auVar47._8_4_;
                auVar57._12_4_ = tray.rdir.field_0._44_4_ * auVar47._12_4_;
                auVar47 = vminps_avx(auVar63,auVar45);
                auVar71 = vminps_avx(auVar74,auVar52);
                auVar47 = vmaxps_avx(auVar47,auVar71);
                auVar71 = vminps_avx(auVar80,auVar57);
                auVar47 = vmaxps_avx(auVar47,auVar71);
                auVar42._0_4_ = auVar47._0_4_ * 0.99999964;
                auVar42._4_4_ = auVar47._4_4_ * 0.99999964;
                auVar42._8_4_ = auVar47._8_4_ * 0.99999964;
                auVar42._12_4_ = auVar47._12_4_ * 0.99999964;
                auVar47 = vmaxps_avx(auVar63,auVar45);
                auVar71 = vmaxps_avx(auVar74,auVar52);
                auVar71 = vminps_avx(auVar47,auVar71);
                auVar47 = vmaxps_avx(auVar80,auVar57);
                auVar71 = vminps_avx(auVar71,auVar47);
                auVar47 = vmaxps_avx(auVar42,(undefined1  [16])tray.tnear.field_0);
                auVar46._0_4_ = auVar71._0_4_ * 1.0000004;
                auVar46._4_4_ = auVar71._4_4_ * 1.0000004;
                auVar46._8_4_ = auVar71._8_4_ * 1.0000004;
                auVar46._12_4_ = auVar71._12_4_ * 1.0000004;
                auVar71 = vminps_avx(auVar46,(undefined1  [16])tray.tfar.field_0);
              }
              else {
                fVar65 = *(float *)((uVar31 - 0x50) + lVar32 * 4);
                fVar68 = *(float *)((uVar31 - 0x40) + lVar32 * 4);
                fVar69 = *(float *)((uVar31 - 0x30) + lVar32 * 4);
                fVar70 = *(float *)((uVar31 - 0x20) + lVar32 * 4);
                fVar1 = *(float *)((uVar31 - 0x10) + lVar32 * 4);
                fVar2 = *(float *)(uVar31 + lVar32 * 4);
                fVar3 = *(float *)(uVar31 + 0x10 + lVar32 * 4);
                fVar4 = *(float *)(uVar31 + 0x20 + lVar32 * 4);
                fVar5 = *(float *)(uVar31 + 0x30 + lVar32 * 4);
                auVar90._0_4_ =
                     (float)tray.dir.field_0._0_4_ * fVar65 +
                     (float)tray.dir.field_0._16_4_ * fVar70 +
                     fVar3 * (float)tray.dir.field_0._32_4_;
                auVar90._4_4_ =
                     (float)tray.dir.field_0._4_4_ * fVar65 +
                     (float)tray.dir.field_0._20_4_ * fVar70 +
                     fVar3 * (float)tray.dir.field_0._36_4_;
                auVar90._8_4_ =
                     (float)tray.dir.field_0._8_4_ * fVar65 +
                     (float)tray.dir.field_0._24_4_ * fVar70 +
                     fVar3 * (float)tray.dir.field_0._40_4_;
                auVar90._12_4_ =
                     (float)tray.dir.field_0._12_4_ * fVar65 +
                     (float)tray.dir.field_0._28_4_ * fVar70 +
                     fVar3 * (float)tray.dir.field_0._44_4_;
                auVar98._0_4_ =
                     (float)tray.dir.field_0._0_4_ * fVar68 +
                     (float)tray.dir.field_0._16_4_ * fVar1 + (float)tray.dir.field_0._32_4_ * fVar4
                ;
                auVar98._4_4_ =
                     (float)tray.dir.field_0._4_4_ * fVar68 +
                     (float)tray.dir.field_0._20_4_ * fVar1 + (float)tray.dir.field_0._36_4_ * fVar4
                ;
                auVar98._8_4_ =
                     (float)tray.dir.field_0._8_4_ * fVar68 +
                     (float)tray.dir.field_0._24_4_ * fVar1 + (float)tray.dir.field_0._40_4_ * fVar4
                ;
                auVar98._12_4_ =
                     (float)tray.dir.field_0._12_4_ * fVar68 +
                     (float)tray.dir.field_0._28_4_ * fVar1 + (float)tray.dir.field_0._44_4_ * fVar4
                ;
                fVar6 = *(float *)(uVar31 + 0x40 + lVar32 * 4);
                auVar81._0_4_ =
                     (float)tray.dir.field_0._0_4_ * fVar69 +
                     (float)tray.dir.field_0._16_4_ * fVar2 + (float)tray.dir.field_0._32_4_ * fVar5
                ;
                auVar81._4_4_ =
                     (float)tray.dir.field_0._4_4_ * fVar69 +
                     (float)tray.dir.field_0._20_4_ * fVar2 + (float)tray.dir.field_0._36_4_ * fVar5
                ;
                auVar81._8_4_ =
                     (float)tray.dir.field_0._8_4_ * fVar69 +
                     (float)tray.dir.field_0._24_4_ * fVar2 + (float)tray.dir.field_0._40_4_ * fVar5
                ;
                auVar81._12_4_ =
                     (float)tray.dir.field_0._12_4_ * fVar69 +
                     (float)tray.dir.field_0._28_4_ * fVar2 + (float)tray.dir.field_0._44_4_ * fVar5
                ;
                auVar106._8_4_ = 0x7fffffff;
                auVar106._0_8_ = 0x7fffffff7fffffff;
                auVar106._12_4_ = 0x7fffffff;
                auVar47 = vandps_avx(auVar90,auVar106);
                auVar108._8_4_ = 0x219392ef;
                auVar108._0_8_ = 0x219392ef219392ef;
                auVar108._12_4_ = 0x219392ef;
                auVar47 = vcmpps_avx(auVar47,auVar108,1);
                auVar71 = vblendvps_avx(auVar90,auVar108,auVar47);
                auVar47 = vandps_avx(auVar98,auVar106);
                auVar47 = vcmpps_avx(auVar47,auVar108,1);
                auVar44 = vblendvps_avx(auVar98,auVar108,auVar47);
                auVar47 = vandps_avx(auVar81,auVar106);
                auVar47 = vcmpps_avx(auVar47,auVar108,1);
                auVar47 = vblendvps_avx(auVar81,auVar108,auVar47);
                auVar60 = vrcpps_avx(auVar71);
                fVar77 = auVar60._0_4_;
                auVar91._0_4_ = fVar77 * auVar71._0_4_;
                fVar82 = auVar60._4_4_;
                auVar91._4_4_ = fVar82 * auVar71._4_4_;
                fVar83 = auVar60._8_4_;
                auVar91._8_4_ = fVar83 * auVar71._8_4_;
                fVar84 = auVar60._12_4_;
                auVar91._12_4_ = fVar84 * auVar71._12_4_;
                auVar107._8_4_ = 0x3f800000;
                auVar107._0_8_ = 0x3f8000003f800000;
                auVar107._12_4_ = 0x3f800000;
                auVar71 = vsubps_avx(auVar107,auVar91);
                fVar77 = fVar77 + fVar77 * auVar71._0_4_;
                fVar82 = fVar82 + fVar82 * auVar71._4_4_;
                fVar83 = fVar83 + fVar83 * auVar71._8_4_;
                fVar84 = fVar84 + fVar84 * auVar71._12_4_;
                auVar71 = vrcpps_avx(auVar44);
                fVar85 = auVar71._0_4_;
                auVar99._0_4_ = fVar85 * auVar44._0_4_;
                fVar93 = auVar71._4_4_;
                auVar99._4_4_ = fVar93 * auVar44._4_4_;
                fVar94 = auVar71._8_4_;
                auVar99._8_4_ = fVar94 * auVar44._8_4_;
                fVar95 = auVar71._12_4_;
                auVar99._12_4_ = fVar95 * auVar44._12_4_;
                auVar71 = vsubps_avx(auVar107,auVar99);
                fVar85 = fVar85 + fVar85 * auVar71._0_4_;
                fVar93 = fVar93 + fVar93 * auVar71._4_4_;
                fVar94 = fVar94 + fVar94 * auVar71._8_4_;
                fVar95 = fVar95 + fVar95 * auVar71._12_4_;
                auVar71 = vrcpps_avx(auVar47);
                fVar96 = auVar71._0_4_;
                auVar104._0_4_ = fVar96 * auVar47._0_4_;
                fVar100 = auVar71._4_4_;
                auVar104._4_4_ = fVar100 * auVar47._4_4_;
                fVar101 = auVar71._8_4_;
                auVar104._8_4_ = fVar101 * auVar47._8_4_;
                fVar102 = auVar71._12_4_;
                auVar104._12_4_ = fVar102 * auVar47._12_4_;
                auVar47 = vsubps_avx(auVar107,auVar104);
                fVar96 = fVar96 + fVar96 * auVar47._0_4_;
                fVar100 = fVar100 + fVar100 * auVar47._4_4_;
                fVar101 = fVar101 + fVar101 * auVar47._8_4_;
                fVar102 = fVar102 + fVar102 * auVar47._12_4_;
                fVar7 = *(float *)(uVar31 + 0x50 + lVar32 * 4);
                fVar8 = *(float *)(uVar31 + 0x60 + lVar32 * 4);
                auVar54._0_4_ =
                     (fVar65 * (float)tray.org.field_0._0_4_ +
                     fVar6 + fVar3 * (float)tray.org.field_0._32_4_ +
                     (float)tray.org.field_0._16_4_ * fVar70) * -fVar77;
                auVar54._4_4_ =
                     (fVar65 * (float)tray.org.field_0._4_4_ +
                     fVar6 + fVar3 * (float)tray.org.field_0._36_4_ +
                     (float)tray.org.field_0._20_4_ * fVar70) * -fVar82;
                auVar54._8_4_ =
                     (fVar65 * (float)tray.org.field_0._8_4_ +
                     fVar6 + fVar3 * (float)tray.org.field_0._40_4_ +
                     (float)tray.org.field_0._24_4_ * fVar70) * -fVar83;
                auVar54._12_4_ =
                     (fVar65 * (float)tray.org.field_0._12_4_ +
                     fVar6 + fVar3 * (float)tray.org.field_0._44_4_ +
                     (float)tray.org.field_0._28_4_ * fVar70) * -fVar84;
                auVar48._0_4_ =
                     (fVar68 * (float)tray.org.field_0._0_4_ +
                     (float)tray.org.field_0._16_4_ * fVar1 +
                     fVar7 + (float)tray.org.field_0._32_4_ * fVar4) * -fVar85;
                auVar48._4_4_ =
                     (fVar68 * (float)tray.org.field_0._4_4_ +
                     (float)tray.org.field_0._20_4_ * fVar1 +
                     fVar7 + (float)tray.org.field_0._36_4_ * fVar4) * -fVar93;
                auVar48._8_4_ =
                     (fVar68 * (float)tray.org.field_0._8_4_ +
                     (float)tray.org.field_0._24_4_ * fVar1 +
                     fVar7 + (float)tray.org.field_0._40_4_ * fVar4) * -fVar94;
                auVar48._12_4_ =
                     (fVar68 * (float)tray.org.field_0._12_4_ +
                     (float)tray.org.field_0._28_4_ * fVar1 +
                     fVar7 + (float)tray.org.field_0._44_4_ * fVar4) * -fVar95;
                auVar43._0_4_ =
                     (fVar69 * (float)tray.org.field_0._0_4_ +
                     (float)tray.org.field_0._16_4_ * fVar2 +
                     fVar8 + (float)tray.org.field_0._32_4_ * fVar5) * -fVar96;
                auVar43._4_4_ =
                     (fVar69 * (float)tray.org.field_0._4_4_ +
                     (float)tray.org.field_0._20_4_ * fVar2 +
                     fVar8 + (float)tray.org.field_0._36_4_ * fVar5) * -fVar100;
                auVar43._8_4_ =
                     (fVar69 * (float)tray.org.field_0._8_4_ +
                     (float)tray.org.field_0._24_4_ * fVar2 +
                     fVar8 + (float)tray.org.field_0._40_4_ * fVar5) * -fVar101;
                auVar43._12_4_ =
                     (fVar69 * (float)tray.org.field_0._12_4_ +
                     (float)tray.org.field_0._28_4_ * fVar2 +
                     fVar8 + (float)tray.org.field_0._44_4_ * fVar5) * -fVar102;
                auVar58._0_4_ = fVar77 + auVar54._0_4_;
                auVar58._4_4_ = fVar82 + auVar54._4_4_;
                auVar58._8_4_ = fVar83 + auVar54._8_4_;
                auVar58._12_4_ = fVar84 + auVar54._12_4_;
                auVar59._0_4_ = fVar85 + auVar48._0_4_;
                auVar59._4_4_ = fVar93 + auVar48._4_4_;
                auVar59._8_4_ = fVar94 + auVar48._8_4_;
                auVar59._12_4_ = fVar95 + auVar48._12_4_;
                auVar92 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
                auVar64._0_4_ = fVar96 + auVar43._0_4_;
                auVar64._4_4_ = fVar100 + auVar43._4_4_;
                auVar64._8_4_ = fVar101 + auVar43._8_4_;
                auVar64._12_4_ = fVar102 + auVar43._12_4_;
                auVar47 = vpminsd_avx(auVar54,auVar58);
                auVar71 = vpminsd_avx(auVar48,auVar59);
                auVar47 = vpmaxsd_avx(auVar47,auVar71);
                auVar71 = vpminsd_avx(auVar43,auVar64);
                auVar47 = vpmaxsd_avx(auVar47,auVar71);
                auVar71 = vpmaxsd_avx(auVar54,auVar58);
                auVar44 = vpmaxsd_avx(auVar48,auVar59);
                auVar44 = vpminsd_avx(auVar71,auVar44);
                auVar71 = vpmaxsd_avx(auVar43,auVar64);
                auVar71 = vpminsd_avx(auVar44,auVar71);
                auVar42._0_4_ = auVar47._0_4_ * 0.99999964;
                auVar42._4_4_ = auVar47._4_4_ * 0.99999964;
                auVar42._8_4_ = auVar47._8_4_ * 0.99999964;
                auVar42._12_4_ = auVar47._12_4_ * 0.99999964;
                auVar47 = vpmaxsd_avx(auVar42,(undefined1  [16])tray.tnear.field_0);
                auVar49._0_4_ = auVar71._0_4_ * 1.0000004;
                auVar49._4_4_ = auVar71._4_4_ * 1.0000004;
                auVar49._8_4_ = auVar71._8_4_ * 1.0000004;
                auVar49._12_4_ = auVar71._12_4_ * 1.0000004;
                auVar71 = vpminsd_avx(auVar49,(undefined1  [16])tray.tfar.field_0);
              }
              auVar47 = vcmpps_avx(auVar47,auVar71,2);
              auVar53._8_8_ = 0x100000001;
              auVar53._0_8_ = 0x100000001;
              sVar24 = sVar33;
              aVar13 = aVar89;
              if ((auVar53 & auVar47) != (undefined1  [16])0x0) {
                auVar47 = vpslld_avx(auVar47,0x1f);
                aVar13 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                         vblendvps_avx(auVar92._0_16_,auVar42,auVar47);
                sVar24 = sVar11;
                if (sVar33 != 8) {
                  pNVar35->ptr = sVar33;
                  pNVar35 = pNVar35 + 1;
                  *paVar34 = aVar89;
                  paVar34 = paVar34 + 1;
                }
              }
              aVar89 = aVar13;
              sVar33 = sVar24;
            }
            if (sVar33 == 8) goto LAB_00ec942d;
            auVar47 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,(undefined1  [16])aVar89,6);
            uVar28 = vmovmskps_avx(auVar47);
            root.ptr = sVar33;
          } while ((byte)uVar30 < (byte)POPCOUNT(uVar28));
          pNVar35->ptr = sVar33;
          pNVar35 = pNVar35 + 1;
          *paVar34 = aVar89;
          paVar34 = paVar34 + 1;
LAB_00ec942d:
          iVar29 = 4;
        }
        else {
          while (uVar31 != 0) {
            sVar33 = 0;
            if (uVar31 != 0) {
              for (; (uVar31 >> sVar33 & 1) == 0; sVar33 = sVar33 + 1) {
              }
            }
            uVar31 = uVar31 & uVar31 - 1;
            bVar26 = occluded1(This,bvh,root,sVar33,&pre,ray,&tray,context);
            if (bVar26) {
              terminated.field_0.i[sVar33] = -1;
            }
          }
          auVar47 = _DAT_01f46b70 & ~(undefined1  [16])terminated.field_0;
          iVar29 = 3;
          auVar92 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          auVar105 = ZEXT1664((undefined1  [16])vVar9.field_0);
          if ((((auVar47 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar47 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar47 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar47[0xf] < '\0') {
            auVar47._8_4_ = 0xff800000;
            auVar47._0_8_ = 0xff800000ff800000;
            auVar47._12_4_ = 0xff800000;
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar47,
                               (undefined1  [16])terminated.field_0);
            iVar29 = 2;
          }
          if (uVar30 < uVar27) goto LAB_00ec9034;
        }
      } while (iVar29 != 3);
LAB_00ec963a:
      auVar47 = vandps_avx(auVar50,(undefined1  [16])terminated.field_0);
      auVar50._8_4_ = 0xff800000;
      auVar50._0_8_ = 0xff800000ff800000;
      auVar50._12_4_ = 0xff800000;
      auVar47 = vmaskmovps_avx(auVar47,auVar50);
      *(undefined1 (*) [16])(ray + 0x80) = auVar47;
      return;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }